

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void tlbi_aa64_ipas2e1is_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  int iVar1;
  CPUState *src_cpu;
  target_ulong addr;
  uint64_t pageaddr;
  CPUState *cs;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  src_cpu = env_cpu(env);
  iVar1 = arm_feature(env,0x20);
  if ((iVar1 != 0) && (((env->cp15).scr_el3 & 1) != 0)) {
    addr = sextract64(value << 0xc,0,0x30);
    tlb_flush_page_by_mmuidx_all_cpus_synced_aarch64(src_cpu,addr,0x800);
  }
  return;
}

Assistant:

static void tlbi_aa64_ipas2e1is_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                      uint64_t value)
{
    CPUState *cs = env_cpu(env);
    uint64_t pageaddr;

    if (!arm_feature(env, ARM_FEATURE_EL2) || !(env->cp15.scr_el3 & SCR_NS)) {
        return;
    }

    pageaddr = sextract64(value << 12, 0, 48);

    tlb_flush_page_by_mmuidx_all_cpus_synced(cs, pageaddr,
                                             ARMMMUIdxBit_Stage2);
}